

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void dump_screen(FILE *dumpfp)

{
  nh_symdef *pnVar1;
  nh_drawing_info *pnVar2;
  nh_bool *pnVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  nh_symdef *pnVar7;
  nh_bool *pnVar8;
  char scrline [81];
  char local_88 [80];
  undefined1 local_38;
  
  pnVar8 = &dbuf[0][0].invis;
  pnVar2 = nh_get_drawing_info();
  lVar5 = 0;
  do {
    pnVar1 = pnVar2->bgelements;
    lVar4 = 0;
    pnVar3 = pnVar8;
    do {
      local_88[lVar4] = pnVar1[*(short *)(pnVar3 + -0xe)].ch;
      if ((long)*(short *)(pnVar3 + -0xc) != 0) {
        local_88[lVar4] = pnVar2->traps[(long)*(short *)(pnVar3 + -0xc) + -1].ch;
      }
      if ((long)*(short *)(pnVar3 + -10) != 0) {
        local_88[lVar4] = pnVar2->objects[(long)*(short *)(pnVar3 + -10) + -1].ch;
      }
      if (*pnVar3 == '\0') {
        iVar6 = (int)*(short *)(pnVar3 + -4);
        if (*(short *)(pnVar3 + -4) != 0) {
          if ((pnVar2->num_monsters < iVar6) && ((*(short *)(pnVar3 + -2) & 8) != 0)) {
            pnVar7 = pnVar2->warnings + (~pnVar2->num_monsters + iVar6);
          }
          else {
            pnVar7 = pnVar2->monsters + (long)iVar6 + -1;
          }
          goto LAB_0016c45d;
        }
      }
      else {
        pnVar7 = pnVar2->invis;
LAB_0016c45d:
        local_88[lVar4] = pnVar7->ch;
      }
      lVar4 = lVar4 + 1;
      pnVar3 = pnVar3 + 0x18;
    } while (lVar4 != 0x50);
    local_38 = 0;
    fprintf((FILE *)dumpfp,"%s\n",local_88);
    lVar5 = lVar5 + 1;
    pnVar8 = pnVar8 + 0x780;
    if (lVar5 == 0x15) {
      return;
    }
  } while( true );
}

Assistant:

void dump_screen(FILE *dumpfp)
{
    int x, y;
    char scrline[COLNO+1];
    const struct nh_drawing_info *di = nh_get_drawing_info();
    const struct nh_dbuf_entry *dbe;
    
    for (y = 0; y < ROWNO; y++) {
	for (x = 0; x < COLNO; x++) {
	    dbe = &dbuf[y][x];
	    scrline[x] = di->bgelements[dbe->bg].ch;
	    if (dbe->trap)	scrline[x] = di->traps[dbe->trap-1].ch;
	    if (dbe->obj)	scrline[x] = di->objects[dbe->obj-1].ch;
	    if (dbe->invis)	scrline[x] = di->invis[0].ch;
	    else if (dbe->mon) {
		if (dbe->mon > di->num_monsters && (dbe->monflags & MON_WARNING))
		    scrline[x] = di->warnings[dbe->mon - 1 - di->num_monsters].ch;
		else
		    scrline[x] = di->monsters[dbe->mon-1].ch;
	    }
	}
	
	scrline[COLNO] = '\0';
	fprintf(dumpfp, "%s\n", scrline);
    }
}